

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O0

pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
cmUVProcessChain::Status::GetException_abi_cxx11_
          (pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Status *this)

{
  pair<cmUVProcessChain::ExceptionCode,_const_char_*> pVar1;
  pair<cmUVProcessChain::ExceptionCode,_char_*> pVar2;
  ExceptionCode local_454;
  pair<cmUVProcessChain::ExceptionCode,_const_char_*> local_450;
  ExceptionCode local_43c;
  pair<cmUVProcessChain::ExceptionCode,_char_*> local_438;
  char local_428 [8];
  char buf [256];
  ExceptionCode local_31c;
  pair<cmUVProcessChain::ExceptionCode,_const_char_*> local_318;
  ExceptionCode local_304;
  pair<cmUVProcessChain::ExceptionCode,_const_char_*> local_300;
  ExceptionCode local_2ec;
  pair<cmUVProcessChain::ExceptionCode,_const_char_*> local_2e8;
  ExceptionCode local_2d4;
  pair<cmUVProcessChain::ExceptionCode,_const_char_*> local_2d0;
  ExceptionCode local_2bc;
  pair<cmUVProcessChain::ExceptionCode,_const_char_*> local_2b8;
  ExceptionCode local_2a4;
  pair<cmUVProcessChain::ExceptionCode,_const_char_*> local_2a0;
  ExceptionCode local_28c;
  pair<cmUVProcessChain::ExceptionCode,_const_char_*> local_288;
  ExceptionCode local_274;
  pair<cmUVProcessChain::ExceptionCode,_const_char_*> local_270;
  ExceptionCode local_25c;
  pair<cmUVProcessChain::ExceptionCode,_const_char_*> local_258;
  ExceptionCode local_244;
  pair<cmUVProcessChain::ExceptionCode,_const_char_*> local_240;
  ExceptionCode local_22c;
  pair<cmUVProcessChain::ExceptionCode,_const_char_*> local_228;
  ExceptionCode local_214;
  pair<cmUVProcessChain::ExceptionCode,_const_char_*> local_210;
  ExceptionCode local_1fc;
  pair<cmUVProcessChain::ExceptionCode,_const_char_*> local_1f8;
  ExceptionCode local_1e4;
  pair<cmUVProcessChain::ExceptionCode,_const_char_*> local_1e0;
  ExceptionCode local_1cc;
  pair<cmUVProcessChain::ExceptionCode,_const_char_*> local_1c8;
  ExceptionCode local_1b4;
  pair<cmUVProcessChain::ExceptionCode,_const_char_*> local_1b0;
  ExceptionCode local_19c;
  pair<cmUVProcessChain::ExceptionCode,_const_char_*> local_198;
  ExceptionCode local_184;
  pair<cmUVProcessChain::ExceptionCode,_const_char_*> local_180;
  ExceptionCode local_16c;
  pair<cmUVProcessChain::ExceptionCode,_const_char_*> local_168;
  ExceptionCode local_154;
  pair<cmUVProcessChain::ExceptionCode,_const_char_*> local_150;
  ExceptionCode local_13c;
  pair<cmUVProcessChain::ExceptionCode,_const_char_*> local_138;
  ExceptionCode local_124;
  pair<cmUVProcessChain::ExceptionCode,_const_char_*> local_120;
  ExceptionCode local_10c;
  pair<cmUVProcessChain::ExceptionCode,_const_char_*> local_108;
  ExceptionCode local_f4;
  pair<cmUVProcessChain::ExceptionCode,_const_char_*> local_f0;
  ExceptionCode local_dc;
  pair<cmUVProcessChain::ExceptionCode,_const_char_*> local_d8;
  ExceptionCode local_c4;
  pair<cmUVProcessChain::ExceptionCode,_const_char_*> local_c0;
  ExceptionCode local_ac;
  pair<cmUVProcessChain::ExceptionCode,_const_char_*> local_a8;
  ExceptionCode local_94;
  pair<cmUVProcessChain::ExceptionCode,_const_char_*> local_90;
  ExceptionCode local_7c;
  pair<cmUVProcessChain::ExceptionCode,_const_char_*> local_78;
  ExceptionCode local_64;
  pair<cmUVProcessChain::ExceptionCode,_const_char_*> local_60;
  ExceptionCode local_4c;
  pair<cmUVProcessChain::ExceptionCode,_const_char_*> local_48;
  char *local_38;
  ExceptionCode local_2c;
  pair<cmUVProcessChain::ExceptionCode,_const_char_*> local_28;
  Status *local_18;
  Status *this_local;
  
  local_18 = this;
  this_local = (Status *)__return_storage_ptr__;
  if (this->SpawnResult == 0) {
    if (((this->Finished & 1U) == 0) || (this->TermSignal == 0)) {
      local_454 = None;
      pVar1 = std::make_pair<cmUVProcessChain::ExceptionCode,char_const(&)[1]>
                        (&local_454,(char (*) [1])0x1017437);
      local_450.second = pVar1.second;
      local_450.first = pVar1.first;
      std::
      pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cmUVProcessChain::ExceptionCode,_const_char_*,_true>(__return_storage_ptr__,&local_450)
      ;
    }
    else {
      switch(this->TermSignal) {
      case 1:
        local_10c = Other;
        pVar1 = std::make_pair<cmUVProcessChain::ExceptionCode,char_const(&)[7]>
                          (&local_10c,(char (*) [7])"SIGHUP");
        local_108.second = pVar1.second;
        local_108.first = pVar1.first;
        std::
        pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<cmUVProcessChain::ExceptionCode,_const_char_*,_true>
                  (__return_storage_ptr__,&local_108);
        break;
      case 2:
        local_ac = Interrupt;
        pVar1 = std::make_pair<cmUVProcessChain::ExceptionCode,char_const(&)[15]>
                          (&local_ac,(char (*) [15])"User interrupt");
        local_a8.second = pVar1.second;
        local_a8.first = pVar1.first;
        std::
        pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<cmUVProcessChain::ExceptionCode,_const_char_*,_true>
                  (__return_storage_ptr__,&local_a8);
        break;
      case 3:
        local_124 = Other;
        pVar1 = std::make_pair<cmUVProcessChain::ExceptionCode,char_const(&)[8]>
                          (&local_124,(char (*) [8])"SIGQUIT");
        local_120.second = pVar1.second;
        local_120.first = pVar1.first;
        std::
        pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<cmUVProcessChain::ExceptionCode,_const_char_*,_true>
                  (__return_storage_ptr__,&local_120);
        break;
      case 4:
        local_94 = Illegal;
        pVar1 = std::make_pair<cmUVProcessChain::ExceptionCode,char_const(&)[20]>
                          (&local_94,(char (*) [20])"Illegal instruction");
        local_90.second = pVar1.second;
        local_90.first = pVar1.first;
        std::
        pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<cmUVProcessChain::ExceptionCode,_const_char_*,_true>
                  (__return_storage_ptr__,&local_90);
        break;
      case 5:
        local_13c = Other;
        pVar1 = std::make_pair<cmUVProcessChain::ExceptionCode,char_const(&)[8]>
                          (&local_13c,(char (*) [8])"SIGTRAP");
        local_138.second = pVar1.second;
        local_138.first = pVar1.first;
        std::
        pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<cmUVProcessChain::ExceptionCode,_const_char_*,_true>
                  (__return_storage_ptr__,&local_138);
        break;
      case 6:
        local_c4 = Other;
        pVar1 = std::make_pair<cmUVProcessChain::ExceptionCode,char_const(&)[19]>
                          (&local_c4,(char (*) [19])"Subprocess aborted");
        local_c0.second = pVar1.second;
        local_c0.first = pVar1.first;
        std::
        pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<cmUVProcessChain::ExceptionCode,_const_char_*,_true>
                  (__return_storage_ptr__,&local_c0);
        break;
      case 7:
        local_64 = Fault;
        pVar1 = std::make_pair<cmUVProcessChain::ExceptionCode,char_const(&)[10]>
                          (&local_64,(char (*) [10])"Bus error");
        local_60.second = pVar1.second;
        local_60.first = pVar1.first;
        std::
        pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<cmUVProcessChain::ExceptionCode,_const_char_*,_true>
                  (__return_storage_ptr__,&local_60);
        break;
      case 8:
        local_7c = Numerical;
        pVar1 = std::make_pair<cmUVProcessChain::ExceptionCode,char_const(&)[25]>
                          (&local_7c,(char (*) [25])"Floating-point exception");
        local_78.second = pVar1.second;
        local_78.first = pVar1.first;
        std::
        pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<cmUVProcessChain::ExceptionCode,_const_char_*,_true>
                  (__return_storage_ptr__,&local_78);
        break;
      case 9:
        local_dc = Other;
        pVar1 = std::make_pair<cmUVProcessChain::ExceptionCode,char_const(&)[18]>
                          (&local_dc,(char (*) [18])"Subprocess killed");
        local_d8.second = pVar1.second;
        local_d8.first = pVar1.first;
        std::
        pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<cmUVProcessChain::ExceptionCode,_const_char_*,_true>
                  (__return_storage_ptr__,&local_d8);
        break;
      case 10:
        local_154 = Other;
        pVar1 = std::make_pair<cmUVProcessChain::ExceptionCode,char_const(&)[8]>
                          (&local_154,(char (*) [8])"SIGUSR1");
        local_150.second = pVar1.second;
        local_150.first = pVar1.first;
        std::
        pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<cmUVProcessChain::ExceptionCode,_const_char_*,_true>
                  (__return_storage_ptr__,&local_150);
        break;
      case 0xb:
        local_4c = Fault;
        pVar1 = std::make_pair<cmUVProcessChain::ExceptionCode,char_const(&)[19]>
                          (&local_4c,(char (*) [19])"Segmentation fault");
        local_48.second = pVar1.second;
        local_48.first = pVar1.first;
        std::
        pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<cmUVProcessChain::ExceptionCode,_const_char_*,_true>
                  (__return_storage_ptr__,&local_48);
        break;
      case 0xc:
        local_16c = Other;
        pVar1 = std::make_pair<cmUVProcessChain::ExceptionCode,char_const(&)[8]>
                          (&local_16c,(char (*) [8])"SIGUSR2");
        local_168.second = pVar1.second;
        local_168.first = pVar1.first;
        std::
        pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<cmUVProcessChain::ExceptionCode,_const_char_*,_true>
                  (__return_storage_ptr__,&local_168);
        break;
      case 0xd:
        local_184 = Other;
        pVar1 = std::make_pair<cmUVProcessChain::ExceptionCode,char_const(&)[8]>
                          (&local_184,(char (*) [8])"SIGPIPE");
        local_180.second = pVar1.second;
        local_180.first = pVar1.first;
        std::
        pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<cmUVProcessChain::ExceptionCode,_const_char_*,_true>
                  (__return_storage_ptr__,&local_180);
        break;
      case 0xe:
        local_19c = Other;
        pVar1 = std::make_pair<cmUVProcessChain::ExceptionCode,char_const(&)[8]>
                          (&local_19c,(char (*) [8])"SIGALRM");
        local_198.second = pVar1.second;
        local_198.first = pVar1.first;
        std::
        pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<cmUVProcessChain::ExceptionCode,_const_char_*,_true>
                  (__return_storage_ptr__,&local_198);
        break;
      case 0xf:
        local_f4 = Other;
        pVar1 = std::make_pair<cmUVProcessChain::ExceptionCode,char_const(&)[22]>
                          (&local_f4,(char (*) [22])"Subprocess terminated");
        local_f0.second = pVar1.second;
        local_f0.first = pVar1.first;
        std::
        pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<cmUVProcessChain::ExceptionCode,_const_char_*,_true>
                  (__return_storage_ptr__,&local_f0);
        break;
      case 0x10:
        local_1b4 = Other;
        pVar1 = std::make_pair<cmUVProcessChain::ExceptionCode,char_const(&)[10]>
                          (&local_1b4,(char (*) [10])"SIGSTKFLT");
        local_1b0.second = pVar1.second;
        local_1b0.first = pVar1.first;
        std::
        pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<cmUVProcessChain::ExceptionCode,_const_char_*,_true>
                  (__return_storage_ptr__,&local_1b0);
        break;
      case 0x11:
        local_1cc = Other;
        pVar1 = std::make_pair<cmUVProcessChain::ExceptionCode,char_const(&)[8]>
                          (&local_1cc,(char (*) [8])0x104204b);
        local_1c8.second = pVar1.second;
        local_1c8.first = pVar1.first;
        std::
        pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<cmUVProcessChain::ExceptionCode,_const_char_*,_true>
                  (__return_storage_ptr__,&local_1c8);
        break;
      case 0x12:
        local_1e4 = Other;
        pVar1 = std::make_pair<cmUVProcessChain::ExceptionCode,char_const(&)[8]>
                          (&local_1e4,(char (*) [8])"SIGCONT");
        local_1e0.second = pVar1.second;
        local_1e0.first = pVar1.first;
        std::
        pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<cmUVProcessChain::ExceptionCode,_const_char_*,_true>
                  (__return_storage_ptr__,&local_1e0);
        break;
      case 0x13:
        local_1fc = Other;
        pVar1 = std::make_pair<cmUVProcessChain::ExceptionCode,char_const(&)[8]>
                          (&local_1fc,(char (*) [8])"SIGSTOP");
        local_1f8.second = pVar1.second;
        local_1f8.first = pVar1.first;
        std::
        pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<cmUVProcessChain::ExceptionCode,_const_char_*,_true>
                  (__return_storage_ptr__,&local_1f8);
        break;
      case 0x14:
        local_214 = Other;
        pVar1 = std::make_pair<cmUVProcessChain::ExceptionCode,char_const(&)[8]>
                          (&local_214,(char (*) [8])"SIGTSTP");
        local_210.second = pVar1.second;
        local_210.first = pVar1.first;
        std::
        pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<cmUVProcessChain::ExceptionCode,_const_char_*,_true>
                  (__return_storage_ptr__,&local_210);
        break;
      case 0x15:
        local_22c = Other;
        pVar1 = std::make_pair<cmUVProcessChain::ExceptionCode,char_const(&)[8]>
                          (&local_22c,(char (*) [8])"SIGTTIN");
        local_228.second = pVar1.second;
        local_228.first = pVar1.first;
        std::
        pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<cmUVProcessChain::ExceptionCode,_const_char_*,_true>
                  (__return_storage_ptr__,&local_228);
        break;
      case 0x16:
        local_244 = Other;
        pVar1 = std::make_pair<cmUVProcessChain::ExceptionCode,char_const(&)[8]>
                          (&local_244,(char (*) [8])"SIGTTOU");
        local_240.second = pVar1.second;
        local_240.first = pVar1.first;
        std::
        pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<cmUVProcessChain::ExceptionCode,_const_char_*,_true>
                  (__return_storage_ptr__,&local_240);
        break;
      case 0x17:
        local_25c = Other;
        pVar1 = std::make_pair<cmUVProcessChain::ExceptionCode,char_const(&)[7]>
                          (&local_25c,(char (*) [7])"SIGURG");
        local_258.second = pVar1.second;
        local_258.first = pVar1.first;
        std::
        pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<cmUVProcessChain::ExceptionCode,_const_char_*,_true>
                  (__return_storage_ptr__,&local_258);
        break;
      case 0x18:
        local_274 = Other;
        pVar1 = std::make_pair<cmUVProcessChain::ExceptionCode,char_const(&)[8]>
                          (&local_274,(char (*) [8])"SIGXCPU");
        local_270.second = pVar1.second;
        local_270.first = pVar1.first;
        std::
        pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<cmUVProcessChain::ExceptionCode,_const_char_*,_true>
                  (__return_storage_ptr__,&local_270);
        break;
      case 0x19:
        local_28c = Other;
        pVar1 = std::make_pair<cmUVProcessChain::ExceptionCode,char_const(&)[8]>
                          (&local_28c,(char (*) [8])"SIGXFSZ");
        local_288.second = pVar1.second;
        local_288.first = pVar1.first;
        std::
        pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<cmUVProcessChain::ExceptionCode,_const_char_*,_true>
                  (__return_storage_ptr__,&local_288);
        break;
      case 0x1a:
        local_2a4 = Other;
        pVar1 = std::make_pair<cmUVProcessChain::ExceptionCode,char_const(&)[10]>
                          (&local_2a4,(char (*) [10])"SIGVTALRM");
        local_2a0.second = pVar1.second;
        local_2a0.first = pVar1.first;
        std::
        pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<cmUVProcessChain::ExceptionCode,_const_char_*,_true>
                  (__return_storage_ptr__,&local_2a0);
        break;
      case 0x1b:
        local_2bc = Other;
        pVar1 = std::make_pair<cmUVProcessChain::ExceptionCode,char_const(&)[8]>
                          (&local_2bc,(char (*) [8])"SIGPROF");
        local_2b8.second = pVar1.second;
        local_2b8.first = pVar1.first;
        std::
        pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<cmUVProcessChain::ExceptionCode,_const_char_*,_true>
                  (__return_storage_ptr__,&local_2b8);
        break;
      case 0x1c:
        local_2d4 = Other;
        pVar1 = std::make_pair<cmUVProcessChain::ExceptionCode,char_const(&)[9]>
                          (&local_2d4,(char (*) [9])"SIGWINCH");
        local_2d0.second = pVar1.second;
        local_2d0.first = pVar1.first;
        std::
        pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<cmUVProcessChain::ExceptionCode,_const_char_*,_true>
                  (__return_storage_ptr__,&local_2d0);
        break;
      case 0x1d:
        local_2ec = Other;
        pVar1 = std::make_pair<cmUVProcessChain::ExceptionCode,char_const(&)[8]>
                          (&local_2ec,(char (*) [8])"SIGPOLL");
        local_2e8.second = pVar1.second;
        local_2e8.first = pVar1.first;
        std::
        pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<cmUVProcessChain::ExceptionCode,_const_char_*,_true>
                  (__return_storage_ptr__,&local_2e8);
        break;
      case 0x1e:
        local_304 = Other;
        pVar1 = std::make_pair<cmUVProcessChain::ExceptionCode,char_const(&)[7]>
                          (&local_304,(char (*) [7])"SIGPWR");
        local_300.second = pVar1.second;
        local_300.first = pVar1.first;
        std::
        pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<cmUVProcessChain::ExceptionCode,_const_char_*,_true>
                  (__return_storage_ptr__,&local_300);
        break;
      case 0x1f:
        local_31c = Other;
        pVar1 = std::make_pair<cmUVProcessChain::ExceptionCode,char_const(&)[7]>
                          (&local_31c,(char (*) [7])"SIGSYS");
        local_318.second = pVar1.second;
        local_318.first = pVar1.first;
        std::
        pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<cmUVProcessChain::ExceptionCode,_const_char_*,_true>
                  (__return_storage_ptr__,&local_318);
        break;
      default:
        snprintf(local_428,0x100,"Signal %d",(ulong)(uint)this->TermSignal);
        local_43c = Other;
        pVar2 = std::make_pair<cmUVProcessChain::ExceptionCode,char(&)[256]>
                          (&local_43c,(char (*) [256])local_428);
        local_438.second = pVar2.second;
        local_438.first = pVar2.first;
        std::
        pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<cmUVProcessChain::ExceptionCode,_char_*,_true>(__return_storage_ptr__,&local_438);
      }
    }
  }
  else {
    local_2c = Spawn;
    local_38 = uv_strerror(this->SpawnResult);
    pVar1 = std::make_pair<cmUVProcessChain::ExceptionCode,char_const*>(&local_2c,&local_38);
    local_28.second = pVar1.second;
    local_28.first = pVar1.first;
    std::
    pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<cmUVProcessChain::ExceptionCode,_const_char_*,_true>(__return_storage_ptr__,&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<cmUVProcessChain::ExceptionCode, std::string>
cmUVProcessChain::Status::GetException() const
{
  if (this->SpawnResult) {
    return std::make_pair(ExceptionCode::Spawn,
                          uv_strerror(this->SpawnResult));
  }
#ifdef _WIN32
  if (this->Finished && (this->ExitStatus & 0xF0000000) == 0xC0000000) {
    // Child terminated due to exceptional behavior.
    switch (this->ExitStatus) {
      case STATUS_CONTROL_C_EXIT:
        return std::make_pair(ExceptionCode::Interrupt, "User interrupt");

      case STATUS_FLOAT_DENORMAL_OPERAND:
        return std::make_pair(ExceptionCode::Numerical,
                              "Floating-point exception (denormal operand)");
      case STATUS_FLOAT_DIVIDE_BY_ZERO:
        return std::make_pair(ExceptionCode::Numerical, "Divide-by-zero");
      case STATUS_FLOAT_INEXACT_RESULT:
        return std::make_pair(ExceptionCode::Numerical,
                              "Floating-point exception (inexact result)");
      case STATUS_FLOAT_INVALID_OPERATION:
        return std::make_pair(ExceptionCode::Numerical,
                              "Invalid floating-point operation");
      case STATUS_FLOAT_OVERFLOW:
        return std::make_pair(ExceptionCode::Numerical,
                              "Floating-point overflow");
      case STATUS_FLOAT_STACK_CHECK:
        return std::make_pair(ExceptionCode::Numerical,
                              "Floating-point stack check failed");
      case STATUS_FLOAT_UNDERFLOW:
        return std::make_pair(ExceptionCode::Numerical,
                              "Floating-point underflow");
#  ifdef STATUS_FLOAT_MULTIPLE_FAULTS
      case STATUS_FLOAT_MULTIPLE_FAULTS:
        return std::make_pair(ExceptionCode::Numerical,
                              "Floating-point exception (multiple faults)");
#  endif
#  ifdef STATUS_FLOAT_MULTIPLE_TRAPS
      case STATUS_FLOAT_MULTIPLE_TRAPS:
        return std::make_pair(ExceptionCode::Numerical,
                              "Floating-point exception (multiple traps)");
#  endif
      case STATUS_INTEGER_DIVIDE_BY_ZERO:
        return std::make_pair(ExceptionCode::Numerical,
                              "Integer divide-by-zero");
      case STATUS_INTEGER_OVERFLOW:
        return std::make_pair(ExceptionCode::Numerical, "Integer overflow");

      case STATUS_DATATYPE_MISALIGNMENT:
        return std::make_pair(ExceptionCode::Fault, "Datatype misalignment");
      case STATUS_ACCESS_VIOLATION:
        return std::make_pair(ExceptionCode::Fault, "Access violation");
      case STATUS_IN_PAGE_ERROR:
        return std::make_pair(ExceptionCode::Fault, "In-page error");
      case STATUS_INVALID_HANDLE:
        return std::make_pair(ExceptionCode::Fault, "Invalid handle");
      case STATUS_NONCONTINUABLE_EXCEPTION:
        return std::make_pair(ExceptionCode::Fault,
                              "Noncontinuable exception");
      case STATUS_INVALID_DISPOSITION:
        return std::make_pair(ExceptionCode::Fault, "Invalid disposition");
      case STATUS_ARRAY_BOUNDS_EXCEEDED:
        return std::make_pair(ExceptionCode::Fault, "Array bounds exceeded");
      case STATUS_STACK_OVERFLOW:
        return std::make_pair(ExceptionCode::Fault, "Stack overflow");

      case STATUS_ILLEGAL_INSTRUCTION:
        return std::make_pair(ExceptionCode::Illegal, "Illegal instruction");
      case STATUS_PRIVILEGED_INSTRUCTION:
        return std::make_pair(ExceptionCode::Illegal,
                              "Privileged instruction");

      case STATUS_NO_MEMORY:
      default: {
        char buf[256];
        snprintf(buf, sizeof(buf), "Exit code 0x%x\n",
                 static_cast<unsigned int>(this->ExitStatus));
        return std::make_pair(ExceptionCode::Other, buf);
      }
    }
  }
#else
  if (this->Finished && this->TermSignal) {
    switch (this->TermSignal) {
#  ifdef SIGSEGV
      case SIGSEGV:
        return std::make_pair(ExceptionCode::Fault, "Segmentation fault");
#  endif
#  ifdef SIGBUS
#    if !defined(SIGSEGV) || SIGBUS != SIGSEGV
      case SIGBUS:
        return std::make_pair(ExceptionCode::Fault, "Bus error");
#    endif
#  endif
#  ifdef SIGFPE
      case SIGFPE:
        return std::make_pair(ExceptionCode::Numerical,
                              "Floating-point exception");
#  endif
#  ifdef SIGILL
      case SIGILL:
        return std::make_pair(ExceptionCode::Illegal, "Illegal instruction");
#  endif
#  ifdef SIGINT
      case SIGINT:
        return std::make_pair(ExceptionCode::Interrupt, "User interrupt");
#  endif
#  ifdef SIGABRT
      case SIGABRT:
        return std::make_pair(ExceptionCode::Other, "Subprocess aborted");
#  endif
#  ifdef SIGKILL
      case SIGKILL:
        return std::make_pair(ExceptionCode::Other, "Subprocess killed");
#  endif
#  ifdef SIGTERM
      case SIGTERM:
        return std::make_pair(ExceptionCode::Other, "Subprocess terminated");
#  endif
#  ifdef SIGHUP
      case SIGHUP:
        return std::make_pair(ExceptionCode::Other, "SIGHUP");
#  endif
#  ifdef SIGQUIT
      case SIGQUIT:
        return std::make_pair(ExceptionCode::Other, "SIGQUIT");
#  endif
#  ifdef SIGTRAP
      case SIGTRAP:
        return std::make_pair(ExceptionCode::Other, "SIGTRAP");
#  endif
#  ifdef SIGIOT
#    if !defined(SIGABRT) || SIGIOT != SIGABRT
      case SIGIOT:
        return std::make_pair(ExceptionCode::Other, "SIGIOT");
#    endif
#  endif
#  ifdef SIGUSR1
      case SIGUSR1:
        return std::make_pair(ExceptionCode::Other, "SIGUSR1");
#  endif
#  ifdef SIGUSR2
      case SIGUSR2:
        return std::make_pair(ExceptionCode::Other, "SIGUSR2");
#  endif
#  ifdef SIGPIPE
      case SIGPIPE:
        return std::make_pair(ExceptionCode::Other, "SIGPIPE");
#  endif
#  ifdef SIGALRM
      case SIGALRM:
        return std::make_pair(ExceptionCode::Other, "SIGALRM");
#  endif
#  ifdef SIGSTKFLT
      case SIGSTKFLT:
        return std::make_pair(ExceptionCode::Other, "SIGSTKFLT");
#  endif
#  ifdef SIGCHLD
      case SIGCHLD:
        return std::make_pair(ExceptionCode::Other, "SIGCHLD");
#  elif defined(SIGCLD)
      case SIGCLD:
        return std::make_pair(ExceptionCode::Other, "SIGCLD");
#  endif
#  ifdef SIGCONT
      case SIGCONT:
        return std::make_pair(ExceptionCode::Other, "SIGCONT");
#  endif
#  ifdef SIGSTOP
      case SIGSTOP:
        return std::make_pair(ExceptionCode::Other, "SIGSTOP");
#  endif
#  ifdef SIGTSTP
      case SIGTSTP:
        return std::make_pair(ExceptionCode::Other, "SIGTSTP");
#  endif
#  ifdef SIGTTIN
      case SIGTTIN:
        return std::make_pair(ExceptionCode::Other, "SIGTTIN");
#  endif
#  ifdef SIGTTOU
      case SIGTTOU:
        return std::make_pair(ExceptionCode::Other, "SIGTTOU");
#  endif
#  ifdef SIGURG
      case SIGURG:
        return std::make_pair(ExceptionCode::Other, "SIGURG");
#  endif
#  ifdef SIGXCPU
      case SIGXCPU:
        return std::make_pair(ExceptionCode::Other, "SIGXCPU");
#  endif
#  ifdef SIGXFSZ
      case SIGXFSZ:
        return std::make_pair(ExceptionCode::Other, "SIGXFSZ");
#  endif
#  ifdef SIGVTALRM
      case SIGVTALRM:
        return std::make_pair(ExceptionCode::Other, "SIGVTALRM");
#  endif
#  ifdef SIGPROF
      case SIGPROF:
        return std::make_pair(ExceptionCode::Other, "SIGPROF");
#  endif
#  ifdef SIGWINCH
      case SIGWINCH:
        return std::make_pair(ExceptionCode::Other, "SIGWINCH");
#  endif
#  ifdef SIGPOLL
      case SIGPOLL:
        return std::make_pair(ExceptionCode::Other, "SIGPOLL");
#  endif
#  ifdef SIGIO
#    if !defined(SIGPOLL) || SIGIO != SIGPOLL
      case SIGIO:
        return std::make_pair(ExceptionCode::Other, "SIGIO");
#    endif
#  endif
#  ifdef SIGPWR
      case SIGPWR:
        return std::make_pair(ExceptionCode::Other, "SIGPWR");
#  endif
#  ifdef SIGSYS
      case SIGSYS:
        return std::make_pair(ExceptionCode::Other, "SIGSYS");
#  endif
#  ifdef SIGUNUSED
#    if !defined(SIGSYS) || SIGUNUSED != SIGSYS
      case SIGUNUSED:
        return std::make_pair(ExceptionCode::Other, "SIGUNUSED");
#    endif
#  endif
      default: {
        char buf[256];
        snprintf(buf, sizeof(buf), "Signal %d", this->TermSignal);
        return std::make_pair(ExceptionCode::Other, buf);
      }
    }
  }
#endif
  return std::make_pair(ExceptionCode::None, "");
}